

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_compressionParameters *pZVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  ZSTD_compressionParameters cPar;
  ZSTD_CCtx_params params_00;
  ZSTD_CCtx_params params_01;
  ZSTD_CCtx_params params_02;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  U32 UVar16;
  U32 UVar17;
  U32 end;
  uint uVar18;
  size_t sVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  ZSTD_CCtx_params *pZVar23;
  size_t *psVar24;
  ZSTD_format_e *pZVar25;
  size_t *psVar26;
  undefined8 *puVar27;
  byte bVar28;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeac;
  undefined8 uVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [24];
  undefined1 in_stack_fffffffffffffeb4 [100];
  undefined1 auVar32 [24];
  undefined4 local_cc;
  undefined4 uStack_c8;
  ZSTD_format_e local_b8;
  ZSTD_compressionParameters ZStack_b4;
  ZSTD_frameParameters local_98;
  int iStack_8c;
  int local_88;
  ZSTD_dictAttachPref_e local_84;
  size_t local_80 [10];
  
  bVar28 = 0;
  if ((cdict == (ZSTD_CDict *)0x0) || (cdict->dictContentSize == 0)) {
    pZVar23 = &params;
    puVar27 = (undefined8 *)&stack0xfffffffffffffe98;
    for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
      *puVar27 = *(undefined8 *)pZVar23;
      pZVar23 = (ZSTD_CCtx_params *)&(pZVar23->cParams).chainLog;
      puVar27 = puVar27 + 1;
    }
    params_01.cParams.windowLog = in_stack_fffffffffffffe9c;
    params_01.format = in_stack_fffffffffffffe98;
    params_01.cParams.chainLog = in_stack_fffffffffffffea0;
    params_01.cParams.hashLog = in_stack_fffffffffffffea4;
    params_01.cParams.searchLog = in_stack_fffffffffffffea8;
    params_01.cParams.minMatch = (int)in_stack_fffffffffffffeac;
    params_01.cParams.targetLength = (int)((ulong)in_stack_fffffffffffffeac >> 0x20);
    auVar30 = in_stack_fffffffffffffeb4._4_12_;
    auVar31 = in_stack_fffffffffffffeb4._52_24_;
    auVar32 = in_stack_fffffffffffffeb4._76_24_;
    params_01.cParams.strategy = in_stack_fffffffffffffeb4._0_4_;
    params_01.fParams.contentSizeFlag = auVar30._0_4_;
    params_01.fParams.checksumFlag = auVar30._4_4_;
    params_01.fParams.noDictIDFlag = auVar30._8_4_;
    params_01.compressionLevel = in_stack_fffffffffffffeb4._16_4_;
    params_01.forceWindow = in_stack_fffffffffffffeb4._20_4_;
    params_01.attachDictPref = in_stack_fffffffffffffeb4._24_4_;
    params_01.nbWorkers = in_stack_fffffffffffffeb4._28_4_;
    params_01._60_4_ = in_stack_fffffffffffffeb4._32_4_;
    params_01.jobSize = in_stack_fffffffffffffeb4._36_8_;
    params_01.overlapLog = in_stack_fffffffffffffeb4._44_4_;
    params_01.rsyncable = in_stack_fffffffffffffeb4._48_4_;
    params_01.ldmParams.enableLdm = auVar31._0_4_;
    params_01.ldmParams.hashLog = auVar31._4_4_;
    params_01.ldmParams.bucketSizeLog = auVar31._8_4_;
    params_01.ldmParams.minMatchLength = auVar31._12_4_;
    params_01.ldmParams.hashRateLog = auVar31._16_4_;
    params_01.ldmParams.windowLog = auVar31._20_4_;
    params_01.customMem.customAlloc = (ZSTD_allocFunction)auVar32._0_8_;
    params_01.customMem.customFree = (ZSTD_freeFunction)auVar32._8_8_;
    params_01.customMem.opaque = (void *)auVar32._16_8_;
    sVar19 = ZSTD_resetCCtx_internal(cctx,params_01,pledgedSrcSize,ZSTDcrp_continue,zbuff);
    if (0xffffffffffffff88 < sVar19) {
      return sVar19;
    }
    sVar19 = ZSTD_compress_insertDictionary
                       ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,&params,dict,
                        dictSize,dictContentType,dtlm,cctx->entropyWorkspace);
    if (0xffffffffffffff88 < sVar19) {
      return sVar19;
    }
    cctx->dictID = (U32)sVar19;
  }
  else {
    ZStack_b4.searchLog = params.cParams.searchLog;
    ZStack_b4.minMatch = params.cParams.minMatch;
    local_b8 = params.format;
    ZStack_b4.windowLog = params.cParams.windowLog;
    uVar18 = ZStack_b4.windowLog;
    ZStack_b4.chainLog = params.cParams.chainLog;
    ZStack_b4.hashLog = params.cParams.hashLog;
    if ((params.forceWindow != 0 || params.attachDictPref == ZSTD_dictForceCopy) ||
        (params.attachDictPref != ZSTD_dictForceAttach && pledgedSrcSize != 0xffffffffffffffff) &&
        attachDictSizeCutoffs[(cdict->matchState).cParams.strategy] < pledgedSrcSize) {
      local_98.contentSizeFlag = params.fParams.contentSizeFlag;
      local_98.checksumFlag = params.fParams.checksumFlag;
      local_98.noDictIDFlag = params.fParams.noDictIDFlag;
      iStack_8c = params.compressionLevel;
      ZStack_b4.targetLength = params.cParams.targetLength;
      ZStack_b4.strategy = params.cParams.strategy;
      local_88 = params.forceWindow;
      local_84 = params.attachDictPref;
      psVar24 = (size_t *)&params.nbWorkers;
      psVar26 = local_80;
      for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
        *psVar26 = *psVar24;
        psVar24 = psVar24 + 1;
        psVar26 = psVar26 + 1;
      }
      uVar2 = (cdict->matchState).cParams.chainLog;
      uVar3 = (cdict->matchState).cParams.hashLog;
      uVar4 = (cdict->matchState).cParams.searchLog;
      uVar5 = (cdict->matchState).cParams.minMatch;
      ZStack_b4.chainLog = uVar2;
      ZStack_b4.hashLog = uVar3;
      ZStack_b4.searchLog = uVar4;
      ZStack_b4.minMatch = uVar5;
      ZStack_b4.targetLength = (cdict->matchState).cParams.targetLength;
      ZStack_b4.strategy = (cdict->matchState).cParams.strategy;
      pZVar25 = &local_b8;
      puVar27 = (undefined8 *)&stack0xfffffffffffffe98;
      for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
        *puVar27 = *(undefined8 *)pZVar25;
        pZVar25 = pZVar25 + 2;
        puVar27 = puVar27 + 1;
      }
      params_00.cParams.windowLog = in_stack_fffffffffffffe9c;
      params_00.format = in_stack_fffffffffffffe98;
      params_00.cParams.chainLog = in_stack_fffffffffffffea0;
      params_00.cParams.hashLog = in_stack_fffffffffffffea4;
      params_00.cParams.searchLog = in_stack_fffffffffffffea8;
      params_00.cParams.minMatch = (int)in_stack_fffffffffffffeac;
      params_00.cParams.targetLength = (int)((ulong)in_stack_fffffffffffffeac >> 0x20);
      auVar30 = in_stack_fffffffffffffeb4._4_12_;
      auVar31 = in_stack_fffffffffffffeb4._52_24_;
      auVar32 = in_stack_fffffffffffffeb4._76_24_;
      params_00.cParams.strategy = in_stack_fffffffffffffeb4._0_4_;
      params_00.fParams.contentSizeFlag = auVar30._0_4_;
      params_00.fParams.checksumFlag = auVar30._4_4_;
      params_00.fParams.noDictIDFlag = auVar30._8_4_;
      params_00.compressionLevel = in_stack_fffffffffffffeb4._16_4_;
      params_00.forceWindow = in_stack_fffffffffffffeb4._20_4_;
      params_00.attachDictPref = in_stack_fffffffffffffeb4._24_4_;
      params_00.nbWorkers = in_stack_fffffffffffffeb4._28_4_;
      params_00._60_4_ = in_stack_fffffffffffffeb4._32_4_;
      params_00.jobSize = in_stack_fffffffffffffeb4._36_8_;
      params_00.overlapLog = in_stack_fffffffffffffeb4._44_4_;
      params_00.rsyncable = in_stack_fffffffffffffeb4._48_4_;
      params_00.ldmParams.enableLdm = auVar31._0_4_;
      params_00.ldmParams.hashLog = auVar31._4_4_;
      params_00.ldmParams.bucketSizeLog = auVar31._8_4_;
      params_00.ldmParams.minMatchLength = auVar31._12_4_;
      params_00.ldmParams.hashRateLog = auVar31._16_4_;
      params_00.ldmParams.windowLog = auVar31._20_4_;
      params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar32._0_8_;
      params_00.customMem.customFree = (ZSTD_freeFunction)auVar32._8_8_;
      params_00.customMem.opaque = (void *)auVar32._16_8_;
      ZSTD_resetCCtx_internal(cctx,params_00,pledgedSrcSize,ZSTDcrp_noMemset,zbuff);
      if ((cdict->matchState).cParams.strategy == ZSTD_fast) {
        lVar22 = 0;
      }
      else {
        lVar22 = 1L << ((byte)(cdict->matchState).cParams.chainLog & 0x3f);
      }
      memcpy((cctx->blockState).matchState.hashTable,(cdict->matchState).hashTable,
             ((1L << ((byte)(cdict->matchState).cParams.hashLog & 0x3f)) + lVar22) * 4);
      memset((cctx->blockState).matchState.hashTable3,0,
             4L << ((byte)(cctx->blockState).matchState.hashLog3 & 0x3f));
      pBVar11 = (cdict->matchState).window.base;
      pBVar12 = (cdict->matchState).window.dictBase;
      UVar16 = (cdict->matchState).window.dictLimit;
      UVar17 = (cdict->matchState).window.lowLimit;
      (cctx->blockState).matchState.window.nextSrc = (cdict->matchState).window.nextSrc;
      (cctx->blockState).matchState.window.base = pBVar11;
      (cctx->blockState).matchState.window.dictBase = pBVar12;
      (cctx->blockState).matchState.window.dictLimit = UVar16;
      (cctx->blockState).matchState.window.lowLimit = UVar17;
      (cctx->blockState).matchState.nextToUpdate3 = (cdict->matchState).nextToUpdate3;
      UVar16 = (cdict->matchState).nextToUpdate;
      (cctx->blockState).matchState.loadedDictEnd = (cdict->matchState).loadedDictEnd;
      (cctx->blockState).matchState.nextToUpdate = UVar16;
      cctx->dictID = cdict->dictID;
      memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x11f0);
      return 0;
    }
    local_98.contentSizeFlag = params.fParams.contentSizeFlag;
    local_98.checksumFlag = params.fParams.checksumFlag;
    local_98.noDictIDFlag = params.fParams.noDictIDFlag;
    iStack_8c = params.compressionLevel;
    ZStack_b4.targetLength = params.cParams.targetLength;
    ZStack_b4.strategy = params.cParams.strategy;
    local_88 = 0;
    local_84 = params.attachDictPref;
    psVar24 = (size_t *)&params.nbWorkers;
    psVar26 = local_80;
    for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
      *psVar26 = *psVar24;
      psVar24 = psVar24 + 1;
      psVar26 = psVar26 + 1;
    }
    pZVar1 = &(cdict->matchState).cParams;
    uVar6 = pZVar1->windowLog;
    uVar7 = pZVar1->chainLog;
    uVar8 = (cdict->matchState).cParams.hashLog;
    uVar9 = (cdict->matchState).cParams.searchLog;
    uVar13 = pZVar1->windowLog;
    uVar14 = pZVar1->chainLog;
    uVar15 = pZVar1->hashLog;
    cPar.hashLog = uVar15;
    cPar.chainLog = uVar14;
    cPar.windowLog = uVar13;
    uVar10 = (cdict->matchState).cParams.minMatch;
    uVar29._0_4_ = (cdict->matchState).cParams.targetLength;
    uVar29._4_4_ = (cdict->matchState).cParams.strategy;
    cPar.searchLog = uVar9;
    cPar.minMatch = uVar10;
    cPar.targetLength = (undefined4)uVar29;
    cPar.strategy = uVar29._4_4_;
    ZSTD_adjustCParams_internal(&ZStack_b4,cPar,pledgedSrcSize,0);
    ZStack_b4.windowLog = uVar18;
    pZVar25 = &local_b8;
    puVar27 = (undefined8 *)&stack0xfffffffffffffe98;
    for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
      *puVar27 = *(undefined8 *)pZVar25;
      pZVar25 = pZVar25 + ((ulong)bVar28 * -2 + 1) * 2;
      puVar27 = puVar27 + (ulong)bVar28 * -2 + 1;
    }
    params_02.cParams.windowLog = uVar7;
    params_02.format = uVar6;
    params_02.cParams.chainLog = uVar8;
    params_02.cParams.hashLog = uVar9;
    params_02.cParams.searchLog = uVar10;
    params_02.cParams.minMatch = (int)uVar29;
    params_02.cParams.targetLength = (int)((ulong)uVar29 >> 0x20);
    auVar30 = in_stack_fffffffffffffeb4._4_12_;
    auVar31 = in_stack_fffffffffffffeb4._52_24_;
    auVar32 = in_stack_fffffffffffffeb4._76_24_;
    params_02.cParams.strategy = in_stack_fffffffffffffeb4._0_4_;
    params_02.fParams.contentSizeFlag = auVar30._0_4_;
    params_02.fParams.checksumFlag = auVar30._4_4_;
    params_02.fParams.noDictIDFlag = auVar30._8_4_;
    params_02.compressionLevel = in_stack_fffffffffffffeb4._16_4_;
    params_02.forceWindow = in_stack_fffffffffffffeb4._20_4_;
    params_02.attachDictPref = in_stack_fffffffffffffeb4._24_4_;
    params_02.nbWorkers = in_stack_fffffffffffffeb4._28_4_;
    params_02._60_4_ = in_stack_fffffffffffffeb4._32_4_;
    params_02.jobSize = in_stack_fffffffffffffeb4._36_8_;
    params_02.overlapLog = in_stack_fffffffffffffeb4._44_4_;
    params_02.rsyncable = in_stack_fffffffffffffeb4._48_4_;
    params_02.ldmParams.enableLdm = auVar31._0_4_;
    params_02.ldmParams.hashLog = auVar31._4_4_;
    params_02.ldmParams.bucketSizeLog = auVar31._8_4_;
    params_02.ldmParams.minMatchLength = auVar31._12_4_;
    params_02.ldmParams.hashRateLog = auVar31._16_4_;
    params_02.ldmParams.windowLog = auVar31._20_4_;
    params_02.customMem.customAlloc = (ZSTD_allocFunction)auVar32._0_8_;
    params_02.customMem.customFree = (ZSTD_freeFunction)auVar32._8_8_;
    params_02.customMem.opaque = (void *)auVar32._16_8_;
    ZSTD_resetCCtx_internal(cctx,params_02,pledgedSrcSize,ZSTDcrp_continue,zbuff);
    uVar20 = (long)(cdict->matchState).window.nextSrc - (long)(cdict->matchState).window.base;
    uVar18 = (uint)uVar20;
    if ((cdict->matchState).window.dictLimit != uVar18) {
      (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
      uVar21 = (cctx->blockState).matchState.window.dictLimit;
      if (uVar21 < uVar18) {
        (cctx->blockState).matchState.window.nextSrc =
             (cctx->blockState).matchState.window.base + (uVar20 & 0xffffffff);
        (cctx->blockState).matchState.window.lowLimit = uVar18;
        (cctx->blockState).matchState.window.dictLimit = uVar18;
        uVar21 = uVar18;
      }
      (cctx->blockState).matchState.loadedDictEnd = uVar21;
    }
    cctx->dictID = cdict->dictID;
    memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x11f0);
  }
  return 0;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    ZSTD_CCtx_params params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params.cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    if (cdict && cdict->dictContentSize>0) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    CHECK_F( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     ZSTDcrp_continue, zbuff) );
    {
        size_t const dictID = ZSTD_compress_insertDictionary(
                cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                &params, dict, dictSize, dictContentType, dtlm, cctx->entropyWorkspace);
        if (ZSTD_isError(dictID)) return dictID;
        assert(dictID <= (size_t)(U32)-1);
        cctx->dictID = (U32)dictID;
    }
    return 0;
}